

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O3

int tsgReadCustomTabulated(void *ct,char *filename)

{
  size_t in_RCX;
  void *in_RDX;
  
  TasGrid::CustomTabulated::read((CustomTabulated *)ct,(int)filename,in_RDX,in_RCX);
  return 1;
}

Assistant:

int tsgReadCustomTabulated(void *ct, const char* filename){
    try{
        ((CustomTabulated*) ct)->read(filename);
        return 1;
    }catch(std::runtime_error &e){
        cerr << e.what() << endl;
        return 0;
    }catch(std::invalid_argument &e){
        cerr << e.what() << endl;
        return 0;
    }
}